

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> * __thiscall
cmDebugger_impl::GetBreakpoints
          (vector<cmBreakpoint,_std::allocator<cmBreakpoint>_> *__return_storage_ptr__,
          cmDebugger_impl *this)

{
  std::mutex::lock(&this->breakpointMutex);
  std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::vector
            (__return_storage_ptr__,&this->breakpoints);
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmBreakpoint> GetBreakpoints() const override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    return breakpoints;
  }